

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stop_time.c
# Opt level: O2

void read_stop_time(stop_time_t *record,int field_count,char **field_names,char **field_values)

{
  int iVar1;
  timepoint_precision_t tVar2;
  stop_type_t sVar3;
  ulong uVar4;
  char *pcVar5;
  stop_time_t *__dest;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  
  init_stop_time(record);
  uVar6 = 0;
  uVar7 = (ulong)(uint)field_count;
  if (field_count < 1) {
    uVar7 = uVar6;
  }
  do {
    if (uVar7 == uVar6) {
      return;
    }
    pcVar5 = field_names[uVar6];
    iVar1 = strcmp(pcVar5,"trip_id");
    if (iVar1 == 0) {
      pcVar5 = field_values[uVar6];
      __dest = record;
LAB_001054a0:
      strcpy(__dest->trip_id,pcVar5);
    }
    else {
      iVar1 = strcmp(pcVar5,"arrival_time");
      if (iVar1 == 0) {
        pcVar5 = field_values[uVar6];
        __dest = (stop_time_t *)record->arrival_time;
        goto LAB_001054a0;
      }
      iVar1 = strcmp(pcVar5,"departure_time");
      if (iVar1 == 0) {
        pcVar5 = field_values[uVar6];
        __dest = (stop_time_t *)record->departure_time;
        goto LAB_001054a0;
      }
      iVar1 = strcmp(pcVar5,"stop_id");
      if (iVar1 == 0) {
        pcVar5 = field_values[uVar6];
        __dest = (stop_time_t *)record->stop_id;
        goto LAB_001054a0;
      }
      iVar1 = strcmp(pcVar5,"stop_sequence");
      if (iVar1 == 0) {
        uVar4 = strtoul(field_values[uVar6],(char **)0x0,0);
        record->stop_sequence = (uint)uVar4;
      }
      else {
        iVar1 = strcmp(pcVar5,"stop_headsign");
        if (iVar1 == 0) {
          pcVar5 = field_values[uVar6];
          __dest = (stop_time_t *)record->stop_headsign;
          goto LAB_001054a0;
        }
        iVar1 = strcmp(pcVar5,"pickup_type");
        if (iVar1 == 0) {
          sVar3 = parse_stop_type(field_values[uVar6]);
          record->pickup_type = sVar3;
        }
        else {
          iVar1 = strcmp(pcVar5,"drop_off_type");
          if (iVar1 == 0) {
            sVar3 = parse_stop_type(field_values[uVar6]);
            record->dropoff_type = sVar3;
          }
          else {
            iVar1 = strcmp(pcVar5,"shape_dist_traveled");
            if (iVar1 == 0) {
              dVar8 = strtod(field_values[uVar6],(char **)0x0);
              record->shape_dist_traveled = dVar8;
            }
            else {
              iVar1 = strcmp(pcVar5,"timepoint");
              if (iVar1 == 0) {
                tVar2 = parse_timepoint_precision(field_values[uVar6]);
                record->timepoint = tVar2;
              }
            }
          }
        }
      }
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

void read_stop_time(stop_time_t *record, int field_count, const char **field_names, const char **field_values) {
    init_stop_time(record);

    for (int i = 0; i < field_count; i++) {
        if (strcmp(field_names[i], "trip_id") == 0) {
            strcpy(record->trip_id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "arrival_time") == 0) {
            strcpy(record->arrival_time, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "departure_time") == 0) {
            strcpy(record->departure_time, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "stop_id") == 0) {
            strcpy(record->stop_id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "stop_sequence") == 0) {
            record->stop_sequence = (unsigned int)strtoul(field_values[i], NULL, 0);
            continue;
        }
        if (strcmp(field_names[i], "stop_headsign") == 0) {
            strcpy(record->stop_headsign, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "pickup_type") == 0) {
            record->pickup_type = parse_stop_type(field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "drop_off_type") == 0) {
            record->dropoff_type = parse_stop_type(field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "shape_dist_traveled") == 0) {
            record->shape_dist_traveled = strtod(field_values[i], NULL);
            continue;
        }
        if (strcmp(field_names[i], "timepoint") == 0) {
            record->timepoint = parse_timepoint_precision(field_values[i]);
            continue;
        }
    }
}